

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

AttVal * prvTidyDupAttrs(TidyDocImpl *doc,AttVal *attrs)

{
  Node *pNVar1;
  AttVal *pAVar2;
  Dict *pDVar3;
  Node *local_38;
  Node *local_30;
  AttVal *newattrs;
  AttVal *attrs_local;
  TidyDocImpl *doc_local;
  
  if (attrs == (AttVal *)0x0) {
    doc_local = (TidyDocImpl *)0x0;
  }
  else {
    doc_local = (TidyDocImpl *)prvTidyNewAttribute(doc);
    memcpy(doc_local,attrs,0x38);
    pNVar1 = (Node *)prvTidyDupAttrs(doc,attrs->next);
    (doc_local->root).parent = pNVar1;
    pAVar2 = (AttVal *)prvTidytmbstrdup(doc->allocator,attrs->attribute);
    (doc_local->root).attributes = pAVar2;
    pDVar3 = (Dict *)prvTidytmbstrdup(doc->allocator,attrs->value);
    (doc_local->root).was = pDVar3;
    pNVar1 = (Node *)prvTidyFindAttribute(doc,(AttVal *)doc_local);
    (doc_local->root).prev = pNVar1;
    if (attrs->asp == (Node *)0x0) {
      local_30 = (Node *)0x0;
    }
    else {
      local_30 = prvTidyCloneNode(doc,attrs->asp);
    }
    (doc_local->root).next = local_30;
    if (attrs->php == (Node *)0x0) {
      local_38 = (Node *)0x0;
    }
    else {
      local_38 = prvTidyCloneNode(doc,attrs->php);
    }
    (doc_local->root).content = local_38;
  }
  return (AttVal *)doc_local;
}

Assistant:

AttVal *TY_(DupAttrs)( TidyDocImpl* doc, AttVal *attrs)
{
    AttVal *newattrs;

    if (attrs == NULL)
        return attrs;

    newattrs = TY_(NewAttribute)(doc);
    *newattrs = *attrs;
    newattrs->next = TY_(DupAttrs)( doc, attrs->next );
    newattrs->attribute = TY_(tmbstrdup)(doc->allocator, attrs->attribute);
    newattrs->value = TY_(tmbstrdup)(doc->allocator, attrs->value);
    newattrs->dict = TY_(FindAttribute)(doc, newattrs);
    newattrs->asp = attrs->asp ? TY_(CloneNode)(doc, attrs->asp) : NULL;
    newattrs->php = attrs->php ? TY_(CloneNode)(doc, attrs->php) : NULL;
    return newattrs;
}